

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_file_scanfn(arg_file *parent,char *argval)

{
  char *pcVar1;
  int local_1c;
  int errorcode;
  char *argval_local;
  arg_file *parent_local;
  
  local_1c = 0;
  if (parent->count == (parent->hdr).maxcount) {
    local_1c = 2;
  }
  else if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
  }
  else {
    parent->filename[parent->count] = argval;
    pcVar1 = arg_basename(argval);
    parent->basename[parent->count] = pcVar1;
    pcVar1 = arg_extension(parent->basename[parent->count]);
    parent->extension[parent->count] = pcVar1;
    parent->count = parent->count + 1;
  }
  return local_1c;
}

Assistant:

static int arg_file_scanfn(struct arg_file* parent, const char* argval) {
    int errorcode = 0;

    if (parent->count == parent->hdr.maxcount) {
        /* maximum number of arguments exceeded */
        errorcode = ARG_ERR_MAXCOUNT;
    } else if (!argval) {
        /* a valid argument with no argument value was given. */
        /* This happens when an optional argument value was invoked. */
        /* leave parent arguiment value unaltered but still count the argument. */
        parent->count++;
    } else {
        parent->filename[parent->count] = argval;
        parent->basename[parent->count] = arg_basename(argval);
        parent->extension[parent->count] =
                arg_extension(parent->basename[parent->count]); /* only seek extensions within the basename (not the file path)*/
        parent->count++;
    }

    ARG_TRACE(("%s4:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
    return errorcode;
}